

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O3

bool __thiscall
cppcms::impl::mem_cache<cppcms::impl::thread_settings>::del_ref
          (mem_cache<cppcms::impl::thread_settings> *this)

{
  int *piVar1;
  int iVar2;
  wrlock_guard lock;
  unique_lock<booster::shared_mutex> local_20;
  
  local_20._M_device =
       (this->access_lock)._M_t.
       super___uniq_ptr_impl<booster::shared_mutex,_std::default_delete<booster::shared_mutex>_>.
       _M_t.
       super__Tuple_impl<0UL,_booster::shared_mutex_*,_std::default_delete<booster::shared_mutex>_>.
       super__Head_base<0UL,_booster::shared_mutex_*,_false>._M_head_impl;
  local_20._M_owns = false;
  std::unique_lock<booster::shared_mutex>::lock(&local_20);
  local_20._M_owns = true;
  piVar1 = &this->refs;
  *piVar1 = *piVar1 + -1;
  iVar2 = *piVar1;
  std::unique_lock<booster::shared_mutex>::~unique_lock(&local_20);
  return iVar2 == 0;
}

Assistant:

virtual bool del_ref()
	{
		// This object should not be deleted because it is created only once
		// and exists in memory
		if(Setup::process_shared)
			return false;
		wrlock_guard lock(*access_lock);
		refs--;
		if(refs==0)
			return true;
		return false;
	}